

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdiriterator.cpp
# Opt level: O0

int __thiscall QDirIteratorPrivate::init(QDirIteratorPrivate *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  bool bVar2;
  const_iterator cVar3;
  long in_FS_OFFSET;
  const_iterator *this_00;
  DirEntry *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = QDirListing::begin(&this->lister);
  (this->it).dirEntry.dirListPtr = (QDirListingPrivate *)cVar3.dirEntry.dirListPtr;
  this_00 = &this->it;
  QDirListing::end(&this->lister);
  bVar2 = ::operator!=(this_00);
  if (bVar2) {
    QDirListing::const_iterator::operator->(&this->it);
    QDirListing::DirEntry::fileInfo(in_stack_ffffffffffffffd8);
    QFileInfo::operator=((QFileInfo *)this_00,(QFileInfo *)this);
    QFileInfo::~QFileInfo((QFileInfo *)0x2a2122);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void init()
    {
        it = lister.begin();
        if (it != lister.end())
            nextFileInfo = it->fileInfo();
    }